

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O3

void button_state_destroy(natwm_state *state)

{
  button_state *__ptr;
  
  __ptr = state->button_state;
  if (__ptr->modifiers != (toggle_modifiers *)0x0) {
    free(__ptr->modifiers->masks);
    free(state->button_state->modifiers);
    __ptr = state->button_state;
  }
  if (__ptr->resize_helper != 0) {
    xcb_unmap_window(state->xcb);
    __ptr = state->button_state;
  }
  free(__ptr);
  return;
}

Assistant:

void button_state_destroy(struct natwm_state *state)
{
        if (state->button_state->modifiers != NULL) {
                free(state->button_state->modifiers->masks);
                free(state->button_state->modifiers);
        }

        if (state->button_state->resize_helper != XCB_NONE) {
                xcb_unmap_window(state->xcb, state->button_state->resize_helper);
        }

        free(state->button_state);
}